

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O0

bool __thiscall cppjieba::HMMModel::GetLine(HMMModel *this,ifstream *ifile,string *line)

{
  bool bVar1;
  istream *piVar2;
  ulong uVar3;
  string *in_RDX;
  istream *in_RSI;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  string *str;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  do {
    do {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (in_RSI,(string *)in_RDX);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
      if (!bVar1) {
        return false;
      }
      limonp::Trim((string *)0x14cb44);
      uVar3 = std::__cxx11::string::empty();
    } while ((uVar3 & 1) != 0);
    str = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffff97 =
         limonp::StartsWith(str,(string *)
                                CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    std::allocator<char>::~allocator(&local_41);
  } while ((in_stack_ffffffffffffff97 & 1) != 0);
  return true;
}

Assistant:

bool GetLine(ifstream& ifile, string& line) {
    while (getline(ifile, line)) {
      Trim(line);
      if (line.empty()) {
        continue;
      }
      if (StartsWith(line, "#")) {
        continue;
      }
      return true;
    }
    return false;
  }